

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::uhugeint_t,bool>
          (BaseAppender *this,Vector *col,uhugeint_t input)

{
  bool bVar1;
  uhugeint_t input_00;
  
  input_00.upper = (Cast *)input.lower;
  input_00.lower = input.upper;
  bVar1 = Cast::Operation<duckdb::uhugeint_t,bool>(input_00.upper,input_00);
  col->data[(this->chunk).count] = bVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}